

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_InterpBndryData.cpp
# Opt level: O2

void __thiscall
amrex::InterpBndryData::BndryValuesDoIt
          (InterpBndryData *this,BndryRegister *crse,int c_start,MultiFab *fine,int f_start,
          int bnd_start,int num_comp,IntVect *ratio,BCRec *bc,int max_order)

{
  MultiFab *this_00;
  undefined1 auVar1 [12];
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Box *pBVar8;
  FArrayBox *pFVar9;
  FArrayBox *pFVar10;
  double *pdVar11;
  double *pdVar12;
  undefined1 auVar13 [12];
  Box *pBVar14;
  undefined8 uVar15;
  byte bVar21;
  int kk;
  uint uVar16;
  long lVar17;
  long lVar18;
  int *piVar19;
  ulong uVar20;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  int iVar34;
  uint uVar35;
  long lVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  uint uVar48;
  long lVar49;
  ulong uVar50;
  uint uVar51;
  int iVar52;
  long lVar53;
  long lVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  uint uVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  int iVar62;
  uint uVar63;
  int n;
  uint uVar64;
  int iVar65;
  undefined8 *puVar66;
  int iVar67;
  ulong uVar68;
  long lVar69;
  long lVar70;
  bool bVar71;
  int iVar73;
  undefined1 auVar72 [16];
  double dVar74;
  undefined1 auVar75 [16];
  double dVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  undefined1 in_XMM10 [16];
  int local_518;
  int local_4ec;
  int local_4cc;
  long local_490;
  long local_470;
  long local_428;
  Box lhs;
  undefined4 uStack_33c;
  int local_338;
  int local_334;
  int local_330;
  Array4<double> bdry_array;
  Array4<int> mask_array;
  MFIter mfi;
  Box local_1e0;
  MFItInfo local_1c4;
  MultiFab foo;
  
  if (bc != (BCRec *)0x0) {
    for (uVar64 = bnd_start; (int)uVar64 < num_comp + bnd_start; uVar64 = uVar64 + 1) {
      (*(this->super_BndryData).super_BndryRegister._vptr_BndryRegister[3])
                (this,bc,ratio,(ulong)uVar64);
    }
  }
  if ((max_order | 2U) != 3) {
    Abort_host("InterpBndryData::setBndryValues supports only max_order=1 or 3");
    return;
  }
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       0x0;
  mfi.fabArray = (FabArrayBase *)0x0;
  lhs.smallend.vect._0_8_ = &PTR__FabFactory_006d8928;
  MultiFab::MultiFab(&foo,&(this->super_BndryData).super_BndryRegister.grids,
                     &(this->super_BndryData).super_BndryRegister.bndry[0].m_mf.
                      super_FabArray<amrex::FArrayBox>.super_FabArrayBase.distributionMap,1,0,
                     (MFInfo *)&mfi,(FabFactory<amrex::FArrayBox> *)&lhs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  local_1c4.do_tiling = false;
  local_1c4.dynamic = true;
  local_1c4.device_sync = true;
  local_1c4.num_streams = Gpu::Device::max_gpu_streams;
  local_1c4.tilesize.vect[0] = 0;
  local_1c4.tilesize.vect[1] = 0;
  local_1c4.tilesize.vect[2] = 0;
  MFIter::MFIter(&mfi,(FabArrayBase *)&foo,&local_1c4);
  if (num_comp < 1) {
    num_comp = 0;
  }
  uVar68 = (ulong)(uint)num_comp;
  lVar29 = (long)c_start;
  lVar26 = (long)bnd_start * 8;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::validbox(&local_1e0,&mfi);
    for (uVar20 = 0; uVar20 != 6; uVar20 = uVar20 + 1) {
      bVar21 = (byte)(((ushort)uVar20 & 0xff) % 3);
      bVar71 = 2 < uVar20;
      iVar34 = (int)uVar20 + -3;
      if (!bVar71) {
        iVar34 = (int)uVar20;
      }
      pBVar14 = &local_1e0;
      if (bVar71) {
        pBVar14 = (Box *)&local_1e0.bigend;
      }
      pBVar8 = (Box *)&(this->super_BndryData).geom.domain.bigend;
      if (!bVar71) {
        pBVar8 = &(this->super_BndryData).geom.domain;
      }
      if (((pBVar14->smallend).vect[bVar21] == (pBVar8->smallend).vect[bVar21]) &&
         (*(char *)((long)(this->super_BndryData).geom.super_CoordSys.inv_dx + (long)iVar34 + 0x19)
          != '\x01')) {
        if (fine != (MultiFab *)0x0) {
          piVar19 = &mfi.currentIndex;
          if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar19 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + mfi.currentIndex;
          }
          pFVar9 = (this->super_BndryData).super_BndryRegister.bndry[uVar20].m_mf.
                   super_FabArray<amrex::FArrayBox>.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar19];
          pFVar10 = (fine->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                    super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[*piVar19];
          pdVar11 = (pFVar9->super_BaseFab<double>).dptr;
          iVar34 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[0];
          iVar73 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[1];
          iVar4 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[2];
          lVar17 = (long)(((pFVar9->super_BaseFab<double>).domain.bigend.vect[0] - iVar34) + 1);
          lVar70 = (long)(((pFVar9->super_BaseFab<double>).domain.bigend.vect[1] - iVar73) + 1);
          lVar56 = (long)(((pFVar9->super_BaseFab<double>).domain.bigend.vect[2] - iVar4) + 1);
          pdVar12 = (pFVar10->super_BaseFab<double>).dptr;
          iVar5 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[0];
          iVar6 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[1];
          iVar7 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[2];
          lhs.smallend.vect._0_8_ =
               *(undefined8 *)(pFVar9->super_BaseFab<double>).domain.smallend.vect;
          uVar15 = *(undefined8 *)((pFVar9->super_BaseFab<double>).domain.smallend.vect + 2);
          auVar1 = *(undefined1 (*) [12])&(pFVar9->super_BaseFab<double>).domain.bigend;
          uVar2 = (pFVar9->super_BaseFab<double>).domain.btype;
          lVar47 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[0] - iVar5) + 1);
          lVar53 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[1] - iVar6) + 1);
          lVar49 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[2] - iVar7) + 1);
          lhs.bigend.vect[1] = auVar1._4_4_;
          lhs.bigend.vect[2] = auVar1._8_4_;
          lhs.smallend.vect[2] = (int)uVar15;
          lhs.bigend.vect[0] = (int)((ulong)uVar15 >> 0x20);
          lhs.btype.itype = uVar2;
          Box::operator&=(&lhs,&(pFVar10->super_BaseFab<double>).domain);
          lVar46 = (long)lhs.smallend.vect[2];
          lVar30 = (long)lhs.smallend.vect[1];
          lVar36 = (long)lhs.smallend.vect[0];
          lVar38 = ((lVar26 * lVar56 + lVar46 * 8 + (long)iVar4 * -8) * lVar70 + lVar30 * 8 +
                   (long)iVar73 * -8) * lVar17 + lVar36 * 8 + (long)iVar34 * -8 + (long)pdVar11;
          lVar54 = lVar70 * lVar17 * 8;
          lVar70 = (((long)f_start * 8 * lVar49 + lVar46 * 8 + (long)iVar7 * -8) * lVar53 +
                    lVar30 * 8 + (long)iVar6 * -8) * lVar47 + lVar36 * 8 + (long)iVar5 * -8 +
                   (long)pdVar12;
          lVar53 = lVar53 * lVar47 * 8;
          for (uVar28 = 0; lVar60 = lVar46, lVar18 = lVar38, lVar61 = lVar70, uVar28 != uVar68;
              uVar28 = uVar28 + 1) {
            for (; lVar39 = lVar30, lVar40 = lVar18, lVar41 = lVar61, lVar60 <= lhs.bigend.vect[2];
                lVar60 = lVar60 + 1) {
              for (; lVar39 <= lhs.bigend.vect[1]; lVar39 = lVar39 + 1) {
                for (lVar33 = 0; lVar36 + lVar33 <= (long)lhs.bigend.vect[0]; lVar33 = lVar33 + 1) {
                  *(undefined8 *)(lVar40 + lVar33 * 8) = *(undefined8 *)(lVar41 + lVar33 * 8);
                }
                lVar40 = lVar40 + lVar17 * 8;
                lVar41 = lVar41 + lVar47 * 8;
              }
              lVar18 = lVar18 + lVar54;
              lVar61 = lVar61 + lVar53;
            }
            lVar38 = lVar38 + lVar56 * lVar54;
            lVar70 = lVar70 + lVar49 * lVar53;
          }
        }
      }
      else {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&lhs,&crse->bndry[uVar20].m_mf.super_FabArray<amrex::FArrayBox>
                   ,&mfi);
        this_00 = &(this->super_BndryData).super_BndryRegister.bndry[uVar20].m_mf;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&bdry_array,&this_00->super_FabArray<amrex::FArrayBox>,&mfi);
        piVar19 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar19 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        pFVar9 = (this_00->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[*piVar19];
        uVar64 = ratio->vect[0];
        uVar28 = *(ulong *)(ratio->vect + 1);
        iVar73 = (int)(uVar28 >> 0x20);
        local_518 = (int)uVar28;
        if (max_order == 1) {
          uVar3 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[0];
          iVar34 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[1];
          iVar4 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[2];
          iVar5 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[0];
          iVar6 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[1];
          iVar7 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[2];
          local_490 = lVar26;
          for (uVar28 = 0; uVar28 != uVar68; uVar28 = uVar28 + 1) {
            for (uVar27 = (long)iVar4; uVar22 = (uint)uVar27, (int)uVar22 <= iVar7;
                uVar27 = uVar27 + 1) {
              for (uVar45 = (long)iVar34; uVar42 = (uint)uVar45, (int)uVar42 <= iVar6;
                  uVar45 = uVar45 + 1) {
                puVar66 = (undefined8 *)
                          ((long)bdry_array.p +
                          bdry_array.nstride * local_490 +
                          (uVar45 - (long)bdry_array.begin.y) * bdry_array.jstride * 8 +
                          (uVar27 - (long)bdry_array.begin.z) * bdry_array.kstride * 8 +
                          (long)bdry_array.begin.x * -8 + (long)(int)uVar3 * 8);
                uVar51 = ~uVar3;
                for (uVar55 = (long)(int)uVar3; (long)uVar55 <= (long)iVar5; uVar55 = uVar55 + 1) {
                  uVar58 = (uint)uVar55;
                  if (uVar64 == 4) {
                    if ((long)uVar55 < 0) {
                      uVar58 = (int)uVar58 >> 2;
                    }
                    else {
                      uVar58 = uVar58 >> 2;
                    }
                  }
                  else if (uVar64 == 2) {
                    if ((long)uVar55 < 0) {
                      uVar58 = (int)uVar58 >> 1;
                    }
                    else {
                      uVar58 = uVar58 >> 1;
                    }
                  }
                  else if (uVar64 != 1) {
                    if ((long)uVar55 < 0) {
                      uVar58 = ~((int)uVar51 / (int)uVar64);
                    }
                    else {
                      uVar58 = (uint)((long)((ulong)(uint)((int)uVar58 >> 0x1f) << 0x20 |
                                            uVar55 & 0xffffffff) / (long)(int)uVar64);
                    }
                  }
                  uVar31 = uVar42;
                  if (((local_518 != 1) && (uVar31 = (int)uVar42 >> 2, local_518 != 4)) &&
                     (uVar31 = (int)uVar42 >> 1, local_518 != 2)) {
                    if ((int)uVar42 < 0) {
                      uVar31 = ~((int)~uVar42 / local_518);
                    }
                    else {
                      uVar31 = (uint)((long)((ulong)(uint)((int)uVar42 >> 0x1f) << 0x20 |
                                            uVar45 & 0xffffffff) / (long)local_518);
                    }
                  }
                  uVar16 = uVar22;
                  if (((iVar73 != 1) && (uVar16 = (int)uVar22 >> 2, iVar73 != 4)) &&
                     (uVar16 = (int)uVar22 >> 1, iVar73 != 2)) {
                    if ((int)uVar22 < 0) {
                      uVar16 = ~((int)~uVar22 / iVar73);
                    }
                    else {
                      uVar16 = (uint)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 |
                                            uVar27 & 0xffffffff) / (long)iVar73);
                    }
                  }
                  *puVar66 = *(undefined8 *)
                              (lhs.smallend.vect._0_8_ +
                               ((long)(int)uVar31 - (long)local_334) *
                               CONCAT44(lhs.bigend.vect[0],lhs.smallend.vect[2]) * 8 +
                               ((long)(int)uVar58 - (long)local_338) * 8 +
                               ((long)(int)uVar16 - (long)local_330) *
                               CONCAT44(lhs.bigend.vect[2],lhs.bigend.vect[1]) * 8 +
                              CONCAT44(uStack_33c,lhs.btype.itype) * (lVar29 + uVar28) * 8);
                  uVar51 = uVar51 - 1;
                  puVar66 = puVar66 + 1;
                }
              }
            }
            local_490 = local_490 + 8;
          }
        }
        else {
          FabArray<amrex::Mask>::array<amrex::Mask,_0>
                    (&mask_array,
                     &(this->super_BndryData).masks.
                      super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
                      super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar20].m_fa,&mfi);
          local_470 = lVar26;
          if (iVar34 == 2) {
            uVar3 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[0];
            iVar34 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[1];
            iVar4 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[1];
            iVar5 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[2];
            iVar6 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[0];
            iVar7 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[2];
            lVar46 = (long)(int)uVar3;
            for (uVar28 = 0; uVar28 != uVar68; uVar28 = uVar28 + 1) {
              for (uVar27 = (long)iVar5; uVar22 = (uint)uVar27, (int)uVar22 <= iVar7;
                  uVar27 = uVar27 + 1) {
                local_4ec = local_518 + iVar4;
                for (uVar45 = (long)iVar4; uVar42 = (uint)uVar45, (int)uVar42 <= iVar34;
                    uVar45 = uVar45 + 1) {
                  lVar70 = CONCAT44(lhs.bigend.vect[0],lhs.smallend.vect[2]);
                  lVar36 = (int)(uVar42 - mask_array.begin.y) * mask_array.jstride;
                  lVar30 = ((long)(int)uVar22 - (long)mask_array.begin.z) * mask_array.kstride;
                  lVar17 = (long)(int)((uVar42 - local_518) - mask_array.begin.y);
                  lVar47 = mask_array.jstride * lVar17;
                  lVar53 = (int)((uVar42 + local_518) - mask_array.begin.y) * mask_array.jstride;
                  lVar49 = CONCAT44(uStack_33c,lhs.btype.itype) * (lVar29 + uVar28);
                  lVar38 = (uVar27 - (long)mask_array.begin.z) * mask_array.kstride;
                  uVar51 = ~uVar3;
                  for (lVar54 = 0; lVar56 = lVar46 + lVar54, lVar56 <= iVar6; lVar54 = lVar54 + 1) {
                    uVar58 = (uint)((ulong)uVar3 + lVar54);
                    if (uVar64 == 4) {
                      if (lVar56 < 0) {
                        uVar58 = (int)uVar58 >> 2;
                      }
                      else {
                        uVar58 = uVar58 >> 2;
                      }
                    }
                    else if (uVar64 == 2) {
                      if (lVar56 < 0) {
                        uVar58 = (int)uVar58 >> 1;
                      }
                      else {
                        uVar58 = uVar58 >> 1;
                      }
                    }
                    else if (uVar64 != 1) {
                      if (lVar56 < 0) {
                        uVar58 = ~((int)uVar51 / (int)uVar64);
                      }
                      else {
                        uVar58 = (uint)((long)((ulong)(uint)((int)uVar58 >> 0x1f) << 0x20 |
                                              (ulong)uVar3 + lVar54 & 0xffffffff) /
                                       (long)(int)uVar64);
                      }
                    }
                    uVar31 = uVar42;
                    if (((local_518 != 1) && (uVar31 = (int)uVar42 >> 2, local_518 != 4)) &&
                       (uVar31 = (int)uVar42 >> 1, local_518 != 2)) {
                      if ((int)uVar42 < 0) {
                        uVar31 = ~((int)~uVar42 / local_518);
                      }
                      else {
                        uVar31 = (uint)((long)((ulong)(uint)((int)uVar42 >> 0x1f) << 0x20 |
                                              uVar45 & 0xffffffff) / (long)local_518);
                      }
                    }
                    uVar16 = uVar22;
                    if (((iVar73 != 1) && (uVar16 = (int)uVar22 >> 2, iVar73 != 4)) &&
                       (uVar16 = (int)uVar22 >> 1, iVar73 != 2)) {
                      if ((int)uVar22 < 0) {
                        uVar16 = ~((int)~uVar22 / iVar73);
                      }
                      else {
                        uVar16 = (uint)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 |
                                              uVar27 & 0xffffffff) / (long)iVar73);
                      }
                    }
                    iVar59 = (int)lVar54;
                    lVar56 = (long)(int)((uVar3 - (uVar64 + mask_array.begin.x)) + iVar59);
                    uVar48 = uVar58 - 1;
                    uVar63 = uVar58;
                    if (mask_array.p[lVar36 + lVar30 + lVar56] == 1) {
                      uVar63 = uVar48;
                    }
                    lVar60 = (long)(int)(((uVar3 + uVar64) - mask_array.begin.x) + iVar59);
                    uVar32 = uVar58 + 1;
                    uVar35 = uVar58;
                    if (mask_array.p[lVar36 + lVar30 + lVar60] == 1) {
                      uVar35 = uVar32;
                    }
                    lVar61 = ((long)(int)uVar16 - (long)local_330) *
                             CONCAT44(lhs.bigend.vect[2],lhs.bigend.vect[1]);
                    lVar18 = lhs.smallend.vect._0_8_ + (int)(uVar31 - local_334) * lVar70 * 8;
                    if (uVar35 == uVar63 + 2) {
                      lVar39 = (long)(int)(uVar58 - local_338);
                      dVar74 = *(double *)(lVar18 + lVar39 * 8 + lVar61 * 8 + lVar49 * 8);
                      dVar74 = ((*(double *)
                                  (lVar18 + (long)(int)(uVar32 - local_338) * 8 + lVar61 * 8 +
                                  lVar49 * 8) - (dVar74 + dVar74)) +
                               *(double *)
                                (lVar18 + (long)(int)(uVar48 - local_338) * 8 + lVar61 * 8 +
                                lVar49 * 8)) * 0.5;
                    }
                    else {
                      lVar39 = (long)(int)(uVar58 - local_338);
                      dVar74 = 0.0;
                    }
                    uVar44 = uVar31 - 1;
                    uVar16 = uVar31;
                    if (*(int *)((long)mask_array.p +
                                lVar54 * 4 +
                                lVar17 * mask_array.jstride * 4 + lVar38 * 4 +
                                (long)mask_array.begin.x * -4 + lVar46 * 4) == 1) {
                      uVar16 = uVar44;
                    }
                    uVar25 = uVar31 + 1;
                    uVar37 = uVar31;
                    if (*(int *)((long)mask_array.p +
                                lVar54 * 4 +
                                (long)(local_4ec - mask_array.begin.y) * mask_array.jstride * 4 +
                                lVar38 * 4 + (long)mask_array.begin.x * -4 + lVar46 * 4) == 1) {
                      uVar37 = uVar25;
                    }
                    dVar80 = 0.0;
                    dVar81 = 0.0;
                    if (uVar37 == uVar16 + 2) {
                      dVar81 = *(double *)(lVar18 + lVar39 * 8 + lVar61 * 8 + lVar49 * 8);
                      dVar81 = ((*(double *)
                                  (lhs.smallend.vect._0_8_ + (int)(uVar25 - local_334) * lVar70 * 8
                                   + lVar39 * 8 + lVar61 * 8 + lVar49 * 8) - (dVar81 + dVar81)) +
                               *(double *)
                                (lhs.smallend.vect._0_8_ + (int)(uVar44 - local_334) * lVar70 * 8 +
                                 lVar39 * 8 + lVar61 * 8 + lVar49 * 8)) * 0.5;
                    }
                    if (((mask_array.p[lVar47 + lVar30 + lVar56] == 1) &&
                        (mask_array.p[lVar47 + lVar30 + lVar60] == 1)) &&
                       ((mask_array.p[lVar53 + lVar30 + lVar56] == 1 &&
                        (mask_array.p[lVar53 + lVar30 + lVar60] == 1)))) {
                      lVar56 = lhs.smallend.vect._0_8_ + (int)(uVar25 - local_334) * lVar70 * 8;
                      lVar60 = lhs.smallend.vect._0_8_ + (int)(uVar44 - local_334) * lVar70 * 8;
                      dVar80 = (((*(double *)
                                   (lVar56 + (long)(int)(uVar32 - local_338) * 8 + lVar61 * 8 +
                                   lVar49 * 8) -
                                 *(double *)
                                  (lVar56 + (long)(int)(uVar48 - local_338) * 8 + lVar61 * 8 +
                                  lVar49 * 8)) +
                                *(double *)
                                 (lVar60 + (long)(int)(uVar48 - local_338) * 8 + lVar61 * 8 +
                                 lVar49 * 8)) -
                               *(double *)
                                (lVar60 + (long)(int)(uVar32 - local_338) * 8 + lVar61 * 8 +
                                lVar49 * 8)) * 0.25;
                    }
                    in_XMM10 = ZEXT816(0x3ff0000000000000);
                    if (uVar37 != uVar16 + 1) {
                      in_XMM10 = ZEXT816(0x3fe0000000000000);
                    }
                    dVar82 = 1.0;
                    if (uVar35 != uVar63 + 1) {
                      dVar82 = 0.5;
                    }
                    dVar83 = ((double)(int)(uVar58 * -uVar64 + uVar3 + iVar59) + 0.5) /
                             (double)(int)uVar64 + -0.5;
                    dVar76 = ((double)(int)(uVar42 - uVar31 * local_518) + 0.5) / (double)local_518
                             + -0.5;
                    *(double *)
                     ((long)bdry_array.p +
                     lVar54 * 8 +
                     bdry_array.nstride * local_470 +
                     (uVar45 - (long)bdry_array.begin.y) * bdry_array.jstride * 8 +
                     (uVar27 - (long)bdry_array.begin.z) * bdry_array.kstride * 8 +
                     (long)bdry_array.begin.x * -8 + lVar46 * 8) =
                         dVar83 * dVar76 * dVar80 +
                         dVar76 * dVar76 * dVar81 +
                         (*(double *)
                           (lhs.smallend.vect._0_8_ + (int)(uVar37 - local_334) * lVar70 * 8 +
                            lVar39 * 8 + lVar61 * 8 + lVar49 * 8) -
                         *(double *)
                          (lhs.smallend.vect._0_8_ + (int)(uVar16 - local_334) * lVar70 * 8 +
                           lVar39 * 8 + lVar61 * 8 + lVar49 * 8)) * in_XMM10._0_8_ * dVar76 +
                         dVar83 * dVar83 * dVar74 +
                         (*(double *)
                           (lVar18 + (long)(int)(uVar35 - local_338) * 8 + lVar61 * 8 + lVar49 * 8)
                         - *(double *)
                            (lVar18 + (long)(int)(uVar63 - local_338) * 8 + lVar61 * 8 + lVar49 * 8)
                         ) * dVar82 * dVar83 +
                         *(double *)(lVar18 + lVar39 * 8 + lVar61 * 8 + lVar49 * 8);
                    uVar51 = uVar51 - 1;
                  }
                  local_4ec = local_4ec + 1;
                }
              }
              local_470 = local_470 + 8;
            }
          }
          else if (iVar34 == 1) {
            uVar3 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[0];
            iVar34 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[1];
            iVar4 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[1];
            iVar5 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[2];
            iVar6 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[0];
            iVar7 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[2];
            auVar13._4_8_ = in_XMM10._8_8_;
            auVar13._0_4_ = iVar73;
            in_XMM10._4_4_ = iVar73;
            in_XMM10._0_4_ = uVar64;
            in_XMM10._8_8_ = 0;
            auVar78._0_8_ = (double)(int)uVar64;
            auVar78._8_8_ = (double)iVar73;
            lVar46 = (long)(int)uVar3;
            local_428 = lVar26;
            for (uVar28 = 0; uVar28 != uVar68; uVar28 = uVar28 + 1) {
              local_4ec = iVar73 + iVar5;
              for (uVar27 = (long)iVar5; uVar22 = (uint)uVar27, (int)uVar22 <= iVar7;
                  uVar27 = uVar27 + 1) {
                for (uVar45 = (long)iVar4; uVar42 = (uint)uVar45, (int)uVar42 <= iVar34;
                    uVar45 = uVar45 + 1) {
                  lVar17 = ((long)(int)uVar42 - (long)mask_array.begin.y) * mask_array.jstride;
                  lVar38 = (int)(uVar22 - mask_array.begin.z) * mask_array.kstride;
                  lVar36 = CONCAT44(uStack_33c,lhs.btype.itype) * (lVar29 + uVar28);
                  lVar49 = (long)(int)((uVar22 - iVar73) - mask_array.begin.z);
                  lVar54 = mask_array.kstride * lVar49;
                  lVar53 = (int)((iVar73 + uVar22) - mask_array.begin.z) * mask_array.kstride;
                  lVar47 = (uVar45 - (long)mask_array.begin.y) * mask_array.jstride;
                  lVar70 = CONCAT44(lhs.bigend.vect[2],lhs.bigend.vect[1]);
                  uVar51 = ~uVar3;
                  for (lVar30 = 0; lVar56 = lVar46 + lVar30, lVar56 <= iVar6; lVar30 = lVar30 + 1) {
                    uVar55 = (ulong)uVar3 + lVar30;
                    uVar58 = (uint)uVar55;
                    if (uVar64 == 4) {
                      if (lVar56 < 0) {
                        uVar55 = (ulong)(uint)((int)uVar58 >> 2);
                      }
                      else {
                        uVar55 = (ulong)(uVar58 >> 2);
                      }
                    }
                    else if (uVar64 == 2) {
                      if (lVar56 < 0) {
                        uVar55 = (ulong)(uint)((int)uVar58 >> 1);
                      }
                      else {
                        uVar55 = (ulong)(uVar58 >> 1);
                      }
                    }
                    else if (uVar64 != 1) {
                      if (lVar56 < 0) {
                        uVar55 = (ulong)(uint)~((int)uVar51 / (int)uVar64);
                      }
                      else {
                        uVar55 = (long)((ulong)(uint)((int)uVar58 >> 0x1f) << 0x20 |
                                       uVar55 & 0xffffffff) / (long)(int)uVar64 & 0xffffffff;
                      }
                    }
                    uVar31 = uVar42;
                    if (((local_518 != 1) && (uVar31 = (int)uVar42 >> 2, local_518 != 4)) &&
                       (uVar31 = (int)uVar42 >> 1, local_518 != 2)) {
                      if ((int)uVar42 < 0) {
                        uVar31 = ~((int)~uVar42 / local_518);
                      }
                      else {
                        uVar31 = (uint)((long)((ulong)(uint)((int)uVar42 >> 0x1f) << 0x20 |
                                              uVar45 & 0xffffffff) / (long)local_518);
                      }
                    }
                    uVar57 = uVar27 & 0xffffffff;
                    if (((iVar73 != 1) && (uVar57 = (ulong)(uint)((int)uVar22 >> 2), iVar73 != 4))
                       && (uVar57 = (ulong)(uint)((int)uVar22 >> 1), iVar73 != 2)) {
                      if ((int)uVar22 < 0) {
                        uVar57 = (ulong)(uint)~((int)~uVar22 / iVar73);
                      }
                      else {
                        uVar57 = (long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 |
                                       uVar27 & 0xffffffff) / (long)iVar73 & 0xffffffff;
                      }
                    }
                    iVar62 = (int)uVar57;
                    lVar56 = (long)(int)((uVar3 - (uVar64 + mask_array.begin.x)) + (int)lVar30);
                    iVar59 = (int)uVar55;
                    iVar43 = iVar59 + -1;
                    iVar24 = iVar59;
                    if (mask_array.p[lVar17 + lVar56 + lVar38] == 1) {
                      iVar24 = iVar43;
                    }
                    lVar60 = (long)(int)(((uVar3 + uVar64) - mask_array.begin.x) + (int)lVar30);
                    iVar52 = iVar59 + 1;
                    iVar65 = iVar59;
                    if (mask_array.p[lVar17 + lVar60 + lVar38] == 1) {
                      iVar65 = iVar52;
                    }
                    lVar61 = (iVar62 - local_330) * lVar70;
                    lVar18 = lhs.smallend.vect._0_8_ +
                             ((long)(int)uVar31 - (long)local_334) *
                             CONCAT44(lhs.bigend.vect[0],lhs.smallend.vect[2]) * 8;
                    if (iVar65 == iVar24 + 2) {
                      lVar39 = (long)(iVar59 - local_338);
                      dVar74 = *(double *)(lVar18 + lVar39 * 8 + lVar61 * 8 + lVar36 * 8);
                      dVar74 = ((*(double *)
                                  (lVar18 + (long)(iVar52 - local_338) * 8 + lVar61 * 8 + lVar36 * 8
                                  ) - (dVar74 + dVar74)) +
                               *(double *)
                                (lVar18 + (long)(iVar43 - local_338) * 8 + lVar61 * 8 + lVar36 * 8))
                               * 0.5;
                    }
                    else {
                      lVar39 = (long)(iVar59 - local_338);
                      dVar74 = 0.0;
                    }
                    iVar23 = iVar62 + -1;
                    iVar59 = iVar62;
                    if (*(int *)((long)mask_array.p +
                                lVar30 * 4 +
                                mask_array.kstride * 4 * lVar49 + lVar47 * 4 +
                                (long)mask_array.begin.x * -4 + lVar46 * 4) == 1) {
                      iVar59 = iVar23;
                    }
                    iVar67 = iVar62 + 1;
                    if (*(int *)((long)mask_array.p +
                                lVar30 * 4 +
                                (long)(local_4ec - mask_array.begin.z) * mask_array.kstride * 4 +
                                lVar47 * 4 + (long)mask_array.begin.x * -4 + lVar46 * 4) == 1) {
                      iVar62 = iVar67;
                    }
                    lVar39 = lVar18 + lVar39 * 8;
                    dVar80 = 0.0;
                    dVar81 = 0.0;
                    if (iVar62 == iVar59 + 2) {
                      dVar81 = *(double *)(lVar39 + lVar61 * 8 + lVar36 * 8);
                      dVar81 = ((*(double *)
                                  (lVar39 + (iVar67 - local_330) * lVar70 * 8 + lVar36 * 8) -
                                (dVar81 + dVar81)) +
                               *(double *)(lVar39 + (iVar23 - local_330) * lVar70 * 8 + lVar36 * 8))
                               * 0.5;
                    }
                    if (((mask_array.p[lVar17 + lVar56 + lVar54] == 1) &&
                        (mask_array.p[lVar17 + lVar60 + lVar54] == 1)) &&
                       ((mask_array.p[lVar17 + lVar56 + lVar53] == 1 &&
                        (mask_array.p[lVar17 + lVar60 + lVar53] == 1)))) {
                      lVar40 = (iVar67 - local_330) * lVar70;
                      lVar56 = lVar18 + (long)(iVar52 - local_338) * 8;
                      lVar60 = lVar18 + (long)(iVar43 - local_338) * 8;
                      lVar41 = (iVar23 - local_330) * lVar70;
                      dVar80 = (((*(double *)(lVar56 + lVar40 * 8 + lVar36 * 8) -
                                 *(double *)(lVar60 + lVar40 * 8 + lVar36 * 8)) +
                                *(double *)(lVar60 + lVar41 * 8 + lVar36 * 8)) -
                               *(double *)(lVar56 + lVar41 * 8 + lVar36 * 8)) * 0.25;
                    }
                    dVar82 = 1.0;
                    if (iVar62 != iVar59 + 1) {
                      dVar82 = 0.5;
                    }
                    dVar83 = 1.0;
                    if (iVar65 != iVar24 + 1) {
                      dVar83 = 0.5;
                    }
                    auVar75._0_8_ =
                         (double)(int)(uVar58 - (int)((uVar55 & 0xffffffff) * (ulong)uVar64)) + 0.5;
                    auVar75._8_8_ =
                         (double)(int)(uVar22 - (int)((auVar13._0_8_ & 0xffffffff) * uVar57)) + 0.5;
                    auVar75 = divpd(auVar75,auVar78);
                    dVar76 = auVar75._0_8_ + -0.5;
                    dVar79 = auVar75._8_8_ + -0.5;
                    *(double *)
                     ((long)bdry_array.p +
                     lVar30 * 8 +
                     bdry_array.nstride * local_428 +
                     (uVar45 - (long)bdry_array.begin.y) * bdry_array.jstride * 8 +
                     (uVar27 - (long)bdry_array.begin.z) * bdry_array.kstride * 8 +
                     (long)bdry_array.begin.x * -8 + lVar46 * 8) =
                         dVar76 * dVar79 * dVar80 +
                         dVar79 * dVar79 * dVar81 +
                         (*(double *)(lVar39 + (iVar62 - local_330) * lVar70 * 8 + lVar36 * 8) -
                         *(double *)(lVar39 + (iVar59 - local_330) * lVar70 * 8 + lVar36 * 8)) *
                         dVar82 * dVar79 +
                         dVar76 * dVar76 * dVar74 +
                         (*(double *)
                           (lVar18 + (long)(iVar65 - local_338) * 8 + lVar61 * 8 + lVar36 * 8) -
                         *(double *)
                          (lVar18 + (long)(iVar24 - local_338) * 8 + lVar61 * 8 + lVar36 * 8)) *
                         dVar83 * dVar76 + *(double *)(lVar39 + lVar61 * 8 + lVar36 * 8);
                    uVar51 = uVar51 - 1;
                  }
                }
                local_4ec = local_4ec + 1;
              }
              local_428 = local_428 + 8;
            }
          }
          else if (iVar34 == 0) {
            uVar3 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[0];
            iVar34 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[1];
            iVar4 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[1];
            iVar5 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[2];
            iVar6 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[0];
            iVar7 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[2];
            auVar72._0_8_ = (double)local_518;
            auVar72._8_8_ = (double)iVar73;
            lVar46 = (long)(int)uVar3;
            for (uVar27 = 0; uVar27 != uVar68; uVar27 = uVar27 + 1) {
              local_4ec = iVar73 + iVar5;
              for (uVar45 = (long)iVar5; uVar22 = (uint)uVar45, (int)uVar22 <= iVar7;
                  uVar45 = uVar45 + 1) {
                local_4cc = local_518 + iVar4;
                for (uVar55 = (long)iVar4; uVar42 = (uint)uVar55, (int)uVar42 <= iVar34;
                    uVar55 = uVar55 + 1) {
                  lVar70 = CONCAT44(lhs.bigend.vect[0],lhs.smallend.vect[2]);
                  lVar17 = (long)mask_array.begin.x;
                  lVar38 = mask_array.kstride * 4;
                  lVar60 = (local_4ec - mask_array.begin.z) * lVar38;
                  lVar49 = mask_array.jstride * 4;
                  lVar56 = (int)(uVar42 - (local_518 + mask_array.begin.y)) * lVar49;
                  lVar30 = (int)(uVar22 - (mask_array.begin.z + iVar73)) * lVar38;
                  lVar38 = (uVar45 - (long)mask_array.begin.z) * lVar38;
                  lVar47 = (local_4cc - mask_array.begin.y) * lVar49;
                  lVar53 = CONCAT44(uStack_33c,lhs.btype.itype) * (lVar29 + uVar27);
                  lVar49 = (uVar55 - (long)mask_array.begin.y) * lVar49;
                  lVar36 = CONCAT44(lhs.bigend.vect[2],lhs.bigend.vect[1]);
                  uVar51 = ~uVar3;
                  for (lVar54 = 0; lVar18 = lVar46 + lVar54, lVar18 <= iVar6; lVar54 = lVar54 + 1) {
                    uVar58 = (uint)((ulong)uVar3 + lVar54);
                    if (uVar64 == 4) {
                      if (lVar18 < 0) {
                        uVar58 = (int)uVar58 >> 2;
                      }
                      else {
                        uVar58 = uVar58 >> 2;
                      }
                    }
                    else if (uVar64 == 2) {
                      if (lVar18 < 0) {
                        uVar58 = (int)uVar58 >> 1;
                      }
                      else {
                        uVar58 = uVar58 >> 1;
                      }
                    }
                    else if (uVar64 != 1) {
                      if (lVar18 < 0) {
                        uVar58 = ~((int)uVar51 / (int)uVar64);
                      }
                      else {
                        uVar58 = (uint)((long)((ulong)(uint)((int)uVar58 >> 0x1f) << 0x20 |
                                              (ulong)uVar3 + lVar54 & 0xffffffff) /
                                       (long)(int)uVar64);
                      }
                    }
                    uVar57 = uVar55 & 0xffffffff;
                    if (((local_518 != 1) &&
                        (uVar57 = (ulong)(uint)((int)uVar42 >> 2), local_518 != 4)) &&
                       (uVar57 = (ulong)(uint)((int)uVar42 >> 1), local_518 != 2)) {
                      if ((int)uVar42 < 0) {
                        uVar57 = (ulong)(uint)~((int)~uVar42 / local_518);
                      }
                      else {
                        uVar57 = (long)((ulong)(uint)((int)uVar42 >> 0x1f) << 0x20 |
                                       uVar55 & 0xffffffff) / (long)local_518 & 0xffffffff;
                      }
                    }
                    iVar59 = (int)uVar57;
                    uVar50 = uVar45 & 0xffffffff;
                    if (((iVar73 != 1) && (uVar50 = (ulong)(uint)((int)uVar22 >> 2), iVar73 != 4))
                       && (uVar50 = (ulong)(uint)((int)uVar22 >> 1), iVar73 != 2)) {
                      if ((int)uVar22 < 0) {
                        uVar50 = (ulong)(uint)~((int)~uVar22 / iVar73);
                      }
                      else {
                        uVar50 = (long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 |
                                       uVar45 & 0xffffffff) / (long)iVar73 & 0xffffffff;
                      }
                    }
                    iVar24 = (int)uVar50;
                    iVar43 = iVar59 + -1;
                    iVar62 = iVar59;
                    if (*(int *)((long)mask_array.p +
                                lVar54 * 4 + lVar56 + lVar38 + lVar17 * -4 + lVar46 * 4) == 1) {
                      iVar62 = iVar43;
                    }
                    iVar52 = iVar59 + 1;
                    iVar65 = iVar59;
                    if (*(int *)((long)mask_array.p +
                                lVar54 * 4 + lVar47 + lVar38 + lVar17 * -4 + lVar46 * 4) == 1) {
                      iVar65 = iVar52;
                    }
                    lVar61 = (long)(int)uVar58 - (long)local_338;
                    lVar18 = (iVar24 - local_330) * lVar36;
                    if (iVar65 == iVar62 + 2) {
                      lVar39 = (iVar59 - local_334) * lVar70;
                      dVar74 = *(double *)
                                (lhs.smallend.vect._0_8_ + lVar39 * 8 + lVar61 * 8 + lVar18 * 8 +
                                lVar53 * 8);
                      dVar74 = ((*(double *)
                                  (lhs.smallend.vect._0_8_ + (iVar52 - local_334) * lVar70 * 8 +
                                   lVar61 * 8 + lVar18 * 8 + lVar53 * 8) - (dVar74 + dVar74)) +
                               *(double *)
                                (lhs.smallend.vect._0_8_ + (iVar43 - local_334) * lVar70 * 8 +
                                 lVar61 * 8 + lVar18 * 8 + lVar53 * 8)) * 0.5;
                    }
                    else {
                      lVar39 = (iVar59 - local_334) * lVar70;
                      dVar74 = 0.0;
                    }
                    iVar23 = iVar24 + -1;
                    iVar59 = iVar24;
                    if (*(int *)((long)mask_array.p +
                                lVar54 * 4 + lVar49 + lVar30 + lVar17 * -4 + lVar46 * 4) == 1) {
                      iVar59 = iVar23;
                    }
                    iVar67 = iVar24 + 1;
                    if (*(int *)((long)mask_array.p +
                                lVar54 * 4 + lVar60 + lVar49 + lVar17 * -4 + lVar46 * 4) == 1) {
                      iVar24 = iVar67;
                    }
                    lVar39 = lVar39 * 8 + lhs.smallend.vect._0_8_ + lVar61 * 8;
                    dVar81 = 0.0;
                    dVar80 = 0.0;
                    if (iVar24 == iVar59 + 2) {
                      dVar80 = *(double *)(lVar39 + lVar18 * 8 + lVar53 * 8);
                      dVar80 = ((*(double *)
                                  (lVar39 + (iVar67 - local_330) * lVar36 * 8 + lVar53 * 8) -
                                (dVar80 + dVar80)) +
                               *(double *)(lVar39 + (iVar23 - local_330) * lVar36 * 8 + lVar53 * 8))
                               * 0.5;
                    }
                    if (((*(int *)((long)mask_array.p +
                                  lVar54 * 4 + lVar30 + lVar56 + lVar17 * -4 + lVar46 * 4) == 1) &&
                        (*(int *)((long)mask_array.p +
                                 lVar54 * 4 + lVar47 + lVar30 + lVar17 * -4 + lVar46 * 4) == 1)) &&
                       ((*(int *)((long)mask_array.p +
                                 lVar54 * 4 + lVar60 + lVar56 + lVar17 * -4 + lVar46 * 4) == 1 &&
                        (*(int *)((long)mask_array.p +
                                 lVar54 * 4 + lVar60 + lVar47 + lVar17 * -4 + lVar46 * 4) == 1)))) {
                      lVar69 = (iVar67 - local_330) * lVar36;
                      lVar40 = lhs.smallend.vect._0_8_ + (iVar52 - local_334) * lVar70 * 8 +
                               lVar61 * 8;
                      lVar41 = lhs.smallend.vect._0_8_ + (iVar43 - local_334) * lVar70 * 8 +
                               lVar61 * 8;
                      lVar33 = (iVar23 - local_330) * lVar36;
                      dVar81 = (((*(double *)(lVar40 + lVar69 * 8 + lVar53 * 8) -
                                 *(double *)(lVar41 + lVar69 * 8 + lVar53 * 8)) +
                                *(double *)(lVar41 + lVar33 * 8 + lVar53 * 8)) -
                               *(double *)(lVar40 + lVar33 * 8 + lVar53 * 8)) * 0.25;
                    }
                    dVar82 = 1.0;
                    if (iVar24 != iVar59 + 1) {
                      dVar82 = 0.5;
                    }
                    dVar83 = 1.0;
                    if (iVar65 != iVar62 + 1) {
                      dVar83 = 0.5;
                    }
                    in_XMM10._8_8_ = 0;
                    in_XMM10._0_8_ = uVar28;
                    auVar77._0_8_ =
                         (double)(int)(uVar42 - (int)(uVar57 * (uVar28 & 0xffffffff))) + 0.5;
                    auVar77._8_8_ = (double)(int)(uVar22 - (int)((uVar28 >> 0x20) * uVar50)) + 0.5;
                    auVar78 = divpd(auVar77,auVar72);
                    dVar76 = auVar78._0_8_ + -0.5;
                    dVar79 = auVar78._8_8_ + -0.5;
                    *(double *)
                     ((long)bdry_array.p +
                     lVar54 * 8 +
                     bdry_array.nstride * local_470 +
                     (uVar55 - (long)bdry_array.begin.y) * bdry_array.jstride * 8 +
                     (uVar45 - (long)bdry_array.begin.z) * bdry_array.kstride * 8 +
                     (long)bdry_array.begin.x * -8 + lVar46 * 8) =
                         dVar76 * dVar79 * dVar81 +
                         dVar79 * dVar79 * dVar80 +
                         (*(double *)(lVar39 + (iVar24 - local_330) * lVar36 * 8 + lVar53 * 8) -
                         *(double *)(lVar39 + (iVar59 - local_330) * lVar36 * 8 + lVar53 * 8)) *
                         dVar82 * dVar79 +
                         dVar76 * dVar76 * dVar74 +
                         (*(double *)
                           (lhs.smallend.vect._0_8_ + (iVar65 - local_334) * lVar70 * 8 + lVar61 * 8
                            + lVar18 * 8 + lVar53 * 8) -
                         *(double *)
                          (lhs.smallend.vect._0_8_ + (iVar62 - local_334) * lVar70 * 8 + lVar61 * 8
                           + lVar18 * 8 + lVar53 * 8)) * dVar83 * dVar76 +
                         *(double *)(lVar39 + lVar18 * 8 + lVar53 * 8);
                    uVar51 = uVar51 - 1;
                  }
                  local_4cc = local_4cc + 1;
                }
                local_4ec = local_4ec + 1;
              }
              local_470 = local_470 + 8;
            }
          }
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  MultiFab::~MultiFab(&foo);
  return;
}

Assistant:

void
InterpBndryData::BndryValuesDoIt (BndryRegister&  crse,
                                  int             c_start,
                                  const MultiFab* fine,
                                  int             f_start,
                                  int             bnd_start,
                                  int             num_comp,
                                  const IntVect&  ratio,
                                  const BCRec*    bc,
                                  int             max_order)
{
    //
    // Check that boxarrays are identical.
    //
    BL_ASSERT(grids.size());
    BL_ASSERT(fine == nullptr || grids == fine->boxArray());
    //
    // Set bndry types and bclocs.
    //
    if (bc != nullptr) {
        for (int n = bnd_start; n < bnd_start+num_comp; ++n) {
            setBndryConds(*bc, ratio, n);
        }
    }
    //
    // First interpolate from coarse to fine on bndry.
    //
    const Box& fine_domain = geom.Domain();

    //
    // Mask turned off if covered by fine grid.
    //
    if (max_order==3 || max_order==1)
    {
        MultiFab foo(grids,bndry[0].DistributionMap(), 1, 0, MFInfo().SetAlloc(false), FArrayBoxFactory());

        MFItInfo info;
        if (Gpu::notInLaunchRegion()) info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(foo,info); mfi.isValid(); ++mfi)
        {
            BL_ASSERT(grids[mfi.index()] == mfi.validbox());

            const Box& fine_bx  = mfi.validbox();

            for (int i = 0; i < 2*AMREX_SPACEDIM; i++)
            {
                const int               dir  = ((i<AMREX_SPACEDIM) ? i : (i-AMREX_SPACEDIM));
                const Orientation::Side side = ((i<AMREX_SPACEDIM) ? Orientation::low : Orientation::high);

                const Orientation face(dir,side);

                if (fine_bx[face] != fine_domain[face] || geom.isPeriodic(dir))
                {
                    auto const crse_array = crse[face].array(mfi);
                    auto       bdry_array = bndry[face].array(mfi);
                    Box const& b = bndry[face][mfi].box();
                    const auto rr = ratio.dim3();
                    //
                    // Internal or periodic edge, interpolate from crse data.
                    //
                    if (max_order == 1)
                    {
                        AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                        {
                            interpbndrydata_o1(it,jt,kt,n,bdry_array,bnd_start,
                                               crse_array,c_start,rr);
                        });
                    }
                    else
                    {
                        auto const mask_array = masks[face].array(mfi);
                        int is_not_covered = BndryData::not_covered;
                        switch (dir) {
                        case 0:
                        {
                            AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                            {
                                interpbndrydata_x_o3(it,jt,kt,n,bdry_array,bnd_start,
                                                     crse_array,c_start,rr,
                                                     mask_array, is_not_covered);
                            });
                            break;
                        }
#if (AMREX_SPACEDIM >= 2)
                        case 1:
                        {
                            AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                            {
                                interpbndrydata_y_o3(it,jt,kt,n,bdry_array,bnd_start,
                                                     crse_array,c_start,rr,
                                                     mask_array, is_not_covered);
                            });
                            break;
                        }
#if (AMREX_SPACEDIM == 3)
                        case 2:
                        {
                            AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                            {
                                interpbndrydata_z_o3(it,jt,kt,n,bdry_array,bnd_start,
                                                     crse_array,c_start,rr,
                                                     mask_array, is_not_covered);
                            });
                            break;
                        }
#endif
#endif
                        default: {}
                        }
                    }
                }
                else if (fine != nullptr)
                {
                    //
                    // Physical bndry, copy from ghost region of corresponding grid
                    //
                    auto& bnd_fab = bndry[face][mfi];
                    auto const& src_fab = (*fine)[mfi];
                    auto bnd_array = bnd_fab.array();
                    auto const src_array = src_fab.array();
                    const Box& b = bnd_fab.box() & src_fab.box();
                    AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, ii, jj, kk, nn,
                    {
                        bnd_array(ii,jj,kk,nn+bnd_start) = src_array(ii,jj,kk,nn+f_start);
                    });
                }
            }
        }
    }
    else
    {
        amrex::Abort("InterpBndryData::setBndryValues supports only max_order=1 or 3");
    }
}